

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

size_t google::protobuf::io::CodedOutputStream::VarintSize32(uint32 value)

{
  uint32 uVar1;
  uint32 log2value;
  uint32 value_local;
  
  uVar1 = Bits::Log2FloorNonZero(value | 1);
  return (ulong)(uVar1 * 9 + 0x49 >> 6);
}

Assistant:

inline size_t CodedOutputStream::VarintSize32(uint32 value) {
  // This computes value == 0 ? 1 : floor(log2(value)) / 7 + 1
  // Use an explicit multiplication to implement the divide of
  // a number in the 1..31 range.
  // Explicit OR 0x1 to avoid calling Bits::Log2FloorNonZero(0), which is
  // undefined.
  uint32 log2value = Bits::Log2FloorNonZero(value | 0x1);
  return static_cast<size_t>((log2value * 9 + 73) / 64);
}